

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_dup_meta_single_to_ctx(ly_ctx *parent_ctx,lyd_meta *meta,lyd_node *parent,lyd_meta **dup)

{
  lyd_meta *plVar1;
  LY_ERR LVar2;
  lyd_meta *meta_00;
  lys_module *plVar3;
  size_t sVar4;
  lysc_ext_instance *ext;
  char *pcVar5;
  lyd_meta *plVar6;
  lyd_meta **pplVar7;
  lysc_type *ant_type;
  
  if (meta == (lyd_meta *)0x0) {
    pcVar5 = "meta";
LAB_001214f4:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,
           "lyd_dup_meta_single_to_ctx");
    return LY_EINVAL;
  }
  if (parent == (lyd_node *)0x0) {
    pcVar5 = "parent";
    goto LAB_001214f4;
  }
  meta_00 = (lyd_meta *)calloc(1,0x48);
  if (meta_00 == (lyd_meta *)0x0) {
    if (parent->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar3 = parent->schema->module;
    }
    ly_log(plVar3->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lyd_dup_meta_single_to_ctx");
    return LY_EMEM;
  }
  plVar3 = meta->annotation->module;
  if (plVar3->ctx == parent_ctx) {
    meta_00->annotation = meta->annotation;
    LVar2 = (*((meta->value).realtype)->plugin->duplicate)(parent_ctx,&meta->value,&meta_00->value);
  }
  else {
    plVar3 = ly_ctx_get_module(parent_ctx,plVar3->name,plVar3->revision);
    pcVar5 = meta->name;
    sVar4 = strlen(pcVar5);
    ext = lyd_get_meta_annotation(plVar3,pcVar5,sVar4);
    meta_00->annotation = ext;
    lyplg_ext_get_storage(ext,0x2e0000,8,&ant_type);
    if (meta_00->annotation == (lysc_ext_instance *)0x0) {
      ly_log(parent_ctx,LY_LLERR,LY_EINVAL,
             "Annotation for metadata %s not found, value duplication failed.",meta->name);
      goto LAB_001215f0;
    }
    pcVar5 = lyd_value_get_canonical(meta->annotation->module->ctx,&meta->value);
    sVar4 = strlen(pcVar5);
    LVar2 = lyd_value_store(parent_ctx,&meta_00->value,ant_type,pcVar5,sVar4,'\x01','\x01',
                            (ly_bool *)0x0,LY_VALUE_CANON,(void *)0x0,0x3f3,parent->schema,
                            (ly_bool *)0x0);
  }
  if (LVar2 == LY_SUCCESS) {
    LVar2 = lydict_insert(parent_ctx,meta->name,0,&meta_00->name);
    if (LVar2 == LY_SUCCESS) {
      meta_00->parent = parent;
      plVar1 = parent->meta;
      if (parent->meta == (lyd_meta *)0x0) {
        pplVar7 = &parent->meta;
      }
      else {
        do {
          plVar6 = plVar1;
          plVar1 = plVar6->next;
        } while (plVar1 != (lyd_meta *)0x0);
        pplVar7 = &plVar6->next;
      }
      *pplVar7 = meta_00;
      if (dup == (lyd_meta **)0x0) {
        return LY_SUCCESS;
      }
      *dup = meta_00;
      return LY_SUCCESS;
    }
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      plVar3 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar3 = parent->schema->module;
    }
    ly_log(plVar3->ctx,LY_LLERR,LY_EINT,"Value duplication failed.");
  }
LAB_001215f0:
  lyd_free_meta_single(meta_00);
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lyd_dup_meta_single_to_ctx(const struct ly_ctx *parent_ctx, const struct lyd_meta *meta, struct lyd_node *parent,
        struct lyd_meta **dup)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_meta *mt, *last;
    const struct lysc_type *ant_type;
    struct lys_module *mod;
    const char *val_can;

    LY_CHECK_ARG_RET(NULL, meta, parent, LY_EINVAL);

    /* create a copy */
    mt = calloc(1, sizeof *mt);
    LY_CHECK_ERR_RET(!mt, LOGMEM(LYD_CTX(parent)), LY_EMEM);

    if (parent_ctx != meta->annotation->module->ctx) {
        /* different contexts */
        mod = ly_ctx_get_module(parent_ctx, meta->annotation->module->name, meta->annotation->module->revision);

        /* annotation */
        mt->annotation = lyd_get_meta_annotation(mod, meta->name, strlen(meta->name));
        lyplg_ext_get_storage(mt->annotation, LY_STMT_TYPE, sizeof ant_type, (const void **)&ant_type);
        LY_CHECK_ERR_GOTO((ret = mt->annotation ? LY_SUCCESS : LY_EINVAL), LOGERR(parent_ctx, LY_EINVAL,
                "Annotation for metadata %s not found, value duplication failed.", meta->name), finish);

        /* duplicate callback expect only the same contexts, so use the store callback */
        val_can = lyd_value_get_canonical(meta->annotation->module->ctx, &meta->value);
        ret = lyd_value_store(parent_ctx, &mt->value, ant_type, val_can, strlen(val_can), 1, 1, NULL,
                LY_VALUE_CANON, NULL, LYD_HINT_DATA, parent->schema, NULL);
    } else {
        /* annotation */
        mt->annotation = meta->annotation;
        /* duplication of value */
        ret = meta->value.realtype->plugin->duplicate(parent_ctx, &meta->value, &mt->value);
    }
    LY_CHECK_ERR_GOTO(ret, LOGERR(LYD_CTX(parent), LY_EINT, "Value duplication failed."), finish);
    LY_CHECK_GOTO(ret = lydict_insert(parent_ctx, meta->name, 0, &mt->name), finish);

    /* insert as the last attribute */
    mt->parent = parent;
    if (parent->meta) {
        for (last = parent->meta; last->next; last = last->next) {}
        last->next = mt;
    } else {
        parent->meta = mt;
    }

finish:
    if (ret) {
        lyd_free_meta_single(mt);
    } else if (dup) {
        *dup = mt;
    }
    return LY_SUCCESS;
}